

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  pointer ppTVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  TestInfo **ppTVar6;
  pointer ppTVar7;
  long lVar8;
  pair<testing::TestInfo_**,_long> pVar9;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  UnitTest::set_current_test_suite(&UnitTest::GetInstance::instance,this);
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  ppTVar7 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar7 != ppTVar2) {
    lVar5 = (long)ppTVar2 - (long)ppTVar7 >> 3;
    pVar9 = std::get_temporary_buffer<testing::TestInfo*>((lVar5 - (lVar5 + 1 >> 0x3f)) + 1 >> 1);
    lVar5 = pVar9.second;
    ppTVar6 = pVar9.first;
    if (ppTVar6 == (TestInfo **)0x0) {
      lVar5 = 0;
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar7,ppTVar2);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestInfo**,long,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar7,ppTVar2,ppTVar6,lVar5);
    }
    operator_delete(ppTVar6,lVar5 << 3);
  }
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x1548ee,(char *)0x0);
  bVar3 = TestResult::Failed(&this->ad_hoc_test_result_);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = TestResult::Skipped(&this->ad_hoc_test_result_);
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar5 / 1000000;
  lVar5 = std::chrono::_V2::steady_clock::now();
  ppTVar7 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7) >> 3)) {
    lVar8 = 1;
    do {
      if (bVar4 == false) {
        TestInfo::Run(ppTVar7[(uint)(this->test_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar8 + -1]]);
      }
      else {
        TestInfo::Skip(ppTVar7[(uint)(this->test_indices_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar8 + -1]]);
      }
      if ((FLAGS_gtest_fail_fast == '\x01') &&
         (bVar3 = TestResult::Failed(&(this->test_info_list_).
                                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(uint)(this->test_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar8 + -1]]->result_)
         , bVar3)) goto LAB_00141ba5;
      ppTVar7 = (this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar3 = lVar8 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7
                                   ) >> 3);
      lVar8 = lVar8 + 1;
    } while (bVar3);
  }
LAB_00141bb9:
  lVar8 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar8 - lVar5) / 1000000;
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x1548fa,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar1);
  UnitTest::GetInstance();
  UnitTest::set_current_test_suite(&UnitTest::GetInstance::instance,(TestSuite *)0x0);
  return;
LAB_00141ba5:
  for (; ppTVar7 = (this->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar8 <
      (int)((ulong)((long)(this->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7) >> 3);
      lVar8 = lVar8 + 1) {
    TestInfo::Skip(ppTVar7[(uint)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar8]]);
  }
  goto LAB_00141bb9;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}